

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int op_reply(lua_State *L)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  size_t sVar7;
  int c;
  int32_t doc_len;
  int i;
  uint8_t *doc;
  int sz;
  int number;
  int starting_from;
  int flags;
  int id;
  anon_struct_32_7_5d1a1af7 *reply;
  char *data;
  size_t data_len;
  lua_State *L_local;
  
  data = (char *)0x0;
  data_len = (size_t)L;
  pcVar6 = luaL_checklstring(L,1,(size_t *)&data);
  if (data < (char *)0x20) {
    lua_pushboolean((lua_State *)data_len,0);
    L_local._4_4_ = 1;
  }
  else {
    uVar1 = little_endian(*(uint32_t *)(pcVar6 + 4));
    uVar2 = little_endian(*(uint32_t *)(pcVar6 + 0xc));
    if ((uVar2 & 2) == 0) {
      uVar2 = little_endian(*(uint32_t *)(pcVar6 + 0x18));
      uVar3 = little_endian(*(uint32_t *)(pcVar6 + 0x1c));
      doc._4_4_ = (int)data + -0x20;
      _doc_len = pcVar6 + 0x20;
      iVar4 = lua_type((lua_State *)data_len,2);
      if (iVar4 == 5) {
        c = 1;
        for (; 4 < doc._4_4_; doc._4_4_ = doc._4_4_ - uVar5) {
          lua_pushlightuserdata((lua_State *)data_len,_doc_len);
          lua_rawseti((lua_State *)data_len,2,(long)c);
          uVar5 = get_length(_doc_len);
          _doc_len = _doc_len + (int)uVar5;
          c = c + 1;
        }
        if (c != uVar3 + 1) {
          lua_pushboolean((lua_State *)data_len,0);
          lua_pushinteger((lua_State *)data_len,(long)(int)uVar1);
          return 2;
        }
        sVar7 = lua_rawlen((lua_State *)data_len,2);
        for (; c <= (int)sVar7; c = c + 1) {
          lua_pushnil((lua_State *)data_len);
          lua_rawseti((lua_State *)data_len,2,(long)c);
        }
      }
      else if (3 < doc._4_4_) {
        uVar5 = get_length(_doc_len);
        doc._4_4_ = doc._4_4_ - uVar5;
      }
      if (doc._4_4_ == 0) {
        lua_pushboolean((lua_State *)data_len,1);
        lua_pushinteger((lua_State *)data_len,(long)(int)uVar1);
        if (uVar3 == 0) {
          lua_pushnil((lua_State *)data_len);
        }
        else {
          lua_pushlightuserdata((lua_State *)data_len,pcVar6 + 0x20);
        }
        if ((*(int *)(pcVar6 + 0x10) == 0) && (*(int *)(pcVar6 + 0x14) == 0)) {
          lua_pushnil((lua_State *)data_len);
        }
        else {
          lua_pushlstring((lua_State *)data_len,pcVar6 + 0x10,8);
        }
        lua_pushinteger((lua_State *)data_len,(long)(int)uVar2);
        L_local._4_4_ = 5;
      }
      else {
        L_local._4_4_ = luaL_error((lua_State *)data_len,"Invalid result bson document");
      }
    }
    else {
      lua_pushboolean((lua_State *)data_len,0);
      lua_pushinteger((lua_State *)data_len,(long)(int)uVar1);
      lua_pushlightuserdata((lua_State *)data_len,pcVar6 + 0x20);
      L_local._4_4_ = 3;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int
op_reply(lua_State *L) {
	size_t data_len = 0;
	const char * data = luaL_checklstring(L,1,&data_len);
	struct {
//		int32_t length; // total message size, including this
		int32_t request_id; // identifier for this message
		int32_t response_id; // requestID from the original request
							// (used in reponses from db)
		int32_t opcode; // request type 
		int32_t flags;
		int32_t cursor_id[2];
		int32_t starting;
		int32_t number;
	} const *reply = (const void *)data;

	if (data_len < sizeof(*reply)) {
		lua_pushboolean(L, 0);
		return 1;
	}

	int id = little_endian(reply->response_id);
	int flags = little_endian(reply->flags);
	if (flags & REPLY_QUERYFAILURE) {
		lua_pushboolean(L,0);
		lua_pushinteger(L, id);
		lua_pushlightuserdata(L, (void *)(reply+1));
		return 3;
	}

	int starting_from = little_endian(reply->starting);
	int number = little_endian(reply->number);
	int sz = (int)data_len - sizeof(*reply);
	const uint8_t * doc = (const uint8_t *)(reply+1);

	if (lua_istable(L,2)) {
		int i = 1;
		while (sz > 4) {
			lua_pushlightuserdata(L, (void *)doc);
			lua_rawseti(L, 2, i);

			int32_t doc_len = get_length((document)doc);

			doc += doc_len;
			sz -= doc_len;

			++i;
		}
		if (i != number + 1) {
			lua_pushboolean(L,0);
			lua_pushinteger(L, id);
			return 2;
		}
		int c = lua_rawlen(L, 2);
		for (;i<=c;i++) {
			lua_pushnil(L);
			lua_rawseti(L, 2, i);
		}
	} else {
		if (sz >= 4) {
			sz -= get_length((document)doc);
		}
	}
	if (sz != 0) {
		return luaL_error(L, "Invalid result bson document");
	}
	lua_pushboolean(L,1);
	lua_pushinteger(L, id);
	if (number == 0)
		lua_pushnil(L);
	else
		lua_pushlightuserdata(L, (void *)(reply+1));
	if (reply->cursor_id[0] == 0 && reply->cursor_id[1]==0) {
		// closed cursor
		lua_pushnil(L);
	} else {
		lua_pushlstring(L, (const char *)(reply->cursor_id), 8);
	}
	lua_pushinteger(L, starting_from);

	return 5;
}